

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

void anon_unknown.dwarf_f0b3e::Multi2Mono<(DevFmtType)6>
               (ALuint chanmask,size_t step,float scale,float *dst,void *src,size_t frames)

{
  unsigned_long in_RCX;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  float *in_R8;
  float in_XMM0_Da;
  float fVar1;
  size_t i_1;
  size_t i;
  size_t c;
  SampleType *ssrc;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  uint in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  std::fill_n<float*,unsigned_long,float>(in_R8,in_RCX,(float *)(ulong)in_stack_ffffffffffffffc0);
  local_48 = 0;
  for (local_4 = in_EDI; local_4 != 0; local_4 = local_4 >> 1) {
    if ((local_4 & 1) != 0) {
      for (local_50 = (float *)0x0; local_50 < in_R8; local_50 = (float *)((long)local_50 + 1)) {
        fVar1 = LoadSample<(DevFmtType)6>
                          (*(Type *)(in_RCX + ((long)local_50 * in_RSI + local_48) * 4));
        *(float *)(in_RDX + (long)local_50 * 4) = fVar1 + *(float *)(in_RDX + (long)local_50 * 4);
      }
    }
    local_48 = local_48 + 1;
  }
  for (local_58 = (float *)0x0; local_58 < in_R8; local_58 = (float *)((long)local_58 + 1)) {
    *(float *)(in_RDX + (long)local_58 * 4) = in_XMM0_Da * *(float *)(in_RDX + (long)local_58 * 4);
  }
  return;
}

Assistant:

void Multi2Mono(ALuint chanmask, const size_t step, const float scale, float *RESTRICT dst,
    const void *src, const size_t frames) noexcept
{
    using SampleType = typename DevFmtTypeTraits<T>::Type;

    const SampleType *ssrc = static_cast<const SampleType*>(src);
    std::fill_n(dst, frames, 0.0f);
    for(size_t c{0};chanmask;++c)
    {
        if LIKELY((chanmask&1))
        {
            for(size_t i{0u};i < frames;i++)
                dst[i] += LoadSample<T>(ssrc[i*step + c]);
        }
        chanmask >>= 1;
    }
    for(size_t i{0u};i < frames;i++)
        dst[i] *= scale;
}